

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  nk_command_buffer *b;
  nk_vec2 nVar1;
  nk_property nVar2;
  byte bVar3;
  nk_hash seed;
  nk_property_kind nVar4;
  nk_panel *pnVar5;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  nk_plugin_filter filter_00;
  double dVar7;
  double dVar8;
  nk_plugin_paste p_Var9;
  undefined8 uVar10;
  long lVar11;
  int *piVar12;
  int *piVar13;
  nk_window *pnVar14;
  undefined1 auVar15 [16];
  int *piVar16;
  int *piVar17;
  nk_button_behavior behavior;
  nk_widget_layout_states nVar18;
  uint uVar19;
  nk_bool nVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  nk_context *pnVar24;
  char *pcVar25;
  ulong uVar26;
  byte *pbVar27;
  int iVar28;
  nk_handle *f;
  long lVar29;
  ulong uVar30;
  nk_context *pnVar31;
  nk_style_property *pnVar32;
  bool bVar33;
  bool bVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined4 uVar40;
  float fVar41;
  undefined4 uVar42;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect b_00;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect bounds_02;
  int num_len;
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  nk_rect bounds;
  char dummy_buffer [64];
  int *local_288;
  char *local_280;
  int local_26c;
  undefined1 local_268 [16];
  int *local_258;
  nk_handle *local_250;
  nk_context *local_248;
  int local_23c;
  undefined8 local_238;
  float fStack_230;
  float fStack_22c;
  int *local_220;
  int *local_218;
  nk_window *local_210;
  nk_rect local_208;
  undefined1 local_1f8 [16];
  int *local_1e0;
  int *local_1d8;
  nk_hash local_1cc;
  float local_1c8;
  float local_1c4;
  nk_button_behavior local_1c0;
  int local_1bc;
  nk_property_filter local_1b8;
  int local_1b4 [5];
  char *local_1a0;
  nk_text local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  byte local_118 [64];
  float local_d8;
  undefined4 uStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  nk_rect local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  char local_78 [72];
  
  local_1b4[4] = 0;
  local_1b4[3] = 0;
  local_1b4[2] = 0;
  local_1b4[1] = 0;
  local_1b4[0] = 0;
  local_210 = ctx->current;
  if (local_210 == (nk_window *)0x0) {
    return;
  }
  pnVar5 = local_210->layout;
  if (pnVar5 == (nk_panel *)0x0) {
    return;
  }
  local_1c8 = inc_per_pixel;
  local_1b8 = filter;
  nVar18 = nk_widget(&local_a8,ctx);
  if (nVar18 == NK_WIDGET_INVALID) {
    return;
  }
  bVar3 = *name;
  uVar26 = (ulong)bVar3;
  if (bVar3 == 0) {
LAB_001256d4:
    local_1cc = nk_murmur_hash(name,(int)uVar26,0x2a);
  }
  else {
    if (bVar3 != 0x23) {
      uVar26 = 0;
      do {
        lVar29 = uVar26 + 1;
        uVar26 = uVar26 + 1;
      } while (name[lVar29] != '\0');
      goto LAB_001256d4;
    }
    lVar29 = 0;
    do {
      lVar23 = lVar29 + 1;
      lVar29 = lVar29 + 1;
    } while (name[lVar23] != '\0');
    seed = (local_210->property).seq;
    (local_210->property).seq = seed + 1;
    local_1cc = nk_murmur_hash(name,(int)lVar29,seed);
    name = name + 1;
  }
  local_1d8 = local_1b4;
  local_1e0 = local_1b4 + 1;
  local_218 = local_1b4 + 2;
  local_258 = local_1b4 + 3;
  local_280 = local_78;
  local_288 = local_1b4 + 4;
  if (((local_210->property).active != 0) && (local_1cc == (local_210->property).name)) {
    local_280 = (local_210->property).buffer;
    local_258 = &(local_210->property).length;
    local_218 = &(local_210->property).cursor;
    local_288 = &(local_210->property).state;
    local_1e0 = &(local_210->property).select_start;
    local_1d8 = &(local_210->property).select_end;
  }
  local_1bc = *local_288;
  (ctx->text_edit).clip.copy = (ctx->clip).copy;
  p_Var9 = (ctx->clip).paste;
  (ctx->text_edit).clip.userdata = (ctx->clip).userdata;
  (ctx->text_edit).clip.paste = p_Var9;
  if ((nVar18 == NK_WIDGET_ROM) && ((local_210->property).active == 0)) {
    pnVar31 = (nk_context *)0x0;
  }
  else {
    pnVar31 = (nk_context *)0x0;
    if ((pnVar5->flags & 0x1000) == 0) {
      pnVar31 = ctx;
    }
  }
  f = &((ctx->style).font)->userdata;
  local_158 = local_a8.y;
  fStack_230 = local_a8.h;
  local_168 = local_a8.w;
  fStack_164 = local_a8.h;
  uStack_160 = 0;
  local_238 = (nk_command_buffer *)CONCAT44(fStack_230,fStack_230);
  local_1f8 = ZEXT416((uint)(*(float *)(f + 1) * 0.5));
  local_1c4 = (ctx->style).property.border;
  local_208.x = local_a8.x;
  local_208.y = local_a8.y;
  local_208.w = 0.0;
  local_208.h = 0.0;
  local_138._0_4_ = local_a8.x + local_1c4 + (ctx->style).property.padding.x;
  uStack_130 = 0;
  if (*name == '\0') {
    lVar29 = 0;
  }
  else {
    lVar29 = 0;
    do {
      lVar23 = lVar29 + 1;
      lVar29 = lVar29 + 1;
    } while (name[lVar23] != '\0');
  }
  local_1c0 = ctx->button_behavior;
  local_250 = f;
  fStack_22c = fStack_230;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  local_138._4_4_ = local_158;
  fVar35 = (*(code *)f[2])(*f,*(float *)(f + 1),name,(int)lVar29);
  piVar12 = local_258;
  fVar39 = (ctx->style).property.border;
  nVar1 = (ctx->style).property.padding;
  fVar36 = nVar1.x;
  fVar41 = nVar1.y;
  local_178 = (float)local_138 + (float)local_1f8._0_4_ + fVar36;
  fStack_174 = fVar39 + local_208.y + fVar41;
  fStack_170 = local_138._4_4_ + local_208.w + 0.0;
  fStack_16c = local_208.h + 0.0 + 0.0;
  local_148 = CONCAT44(fVar41,fVar36 + fVar36 + fVar35);
  uStack_140 = 0;
  local_188 = local_208.x + local_168;
  fStack_184 = local_208.y;
  fStack_180 = local_208.w;
  fStack_17c = local_208.h;
  local_128 = (local_208.x + local_168) - ((float)local_1f8._0_4_ + fVar36);
  fStack_124 = local_208.y;
  fStack_120 = local_208.w;
  uStack_11c = local_208.h;
  local_268 = ZEXT416((uint)(fVar39 + fVar39 + fVar41 + fVar41));
  local_248 = pnVar31;
  if (*local_288 != 1) {
    nVar4 = variant->kind;
    if (nVar4 == NK_PROPERTY_DOUBLE) {
      nk_dtoa((char *)local_118,(variant->value).d);
      lVar23 = 0;
      iVar21 = 0;
      do {
        iVar28 = 1;
        if (local_118[lVar23] != 0x2e) {
          if (local_118[lVar23] == 0) goto LAB_00125b85;
          if (iVar21 == 3) goto LAB_00125a82;
          iVar28 = (uint)(0 < iVar21) + iVar21;
        }
        lVar23 = lVar23 + 1;
        iVar21 = iVar28;
      } while( true );
    }
    if (nVar4 == NK_PROPERTY_FLOAT) {
      nk_dtoa((char *)local_118,(double)(variant->value).f);
      lVar23 = 0;
      iVar21 = 0;
      do {
        iVar28 = 1;
        if (local_118[lVar23] != 0x2e) {
          if (local_118[lVar23] == 0) goto LAB_00125b85;
          if (iVar21 == 3) goto LAB_00125a82;
          iVar28 = (uint)(0 < iVar21) + iVar21;
        }
        lVar23 = lVar23 + 1;
        iVar21 = iVar28;
      } while( true );
    }
    if (nVar4 == NK_PROPERTY_INT) {
      iVar21 = (variant->value).i;
      uVar26 = (ulong)iVar21;
      if (uVar26 == 0) {
        local_118[0] = 0x30;
        local_118[1] = 0;
      }
      else {
        if (iVar21 < 0) {
          local_118[0] = 0x2d;
          uVar26 = -uVar26;
        }
        uVar30 = (ulong)(iVar21 < 0);
        if (0 < (long)uVar26) {
          do {
            local_118[uVar30] = (char)uVar26 + (char)(uVar26 / 10) * -10 | 0x30;
            uVar30 = uVar30 + 1;
            bVar34 = 9 < uVar26;
            uVar26 = uVar26 / 10;
          } while (bVar34);
        }
        local_118[uVar30] = 0;
        uVar26 = (ulong)(local_118[0] == 0x2d);
        if (local_118[uVar26] == 0) {
          lVar23 = 0;
        }
        else {
          lVar23 = 0;
          do {
            lVar11 = lVar23 + uVar26;
            lVar23 = lVar23 + 1;
          } while (local_118[lVar11 + 1] != 0);
        }
        uVar19 = (uint)lVar23;
        if (1 < uVar19) {
          pbVar27 = (byte *)((long)&uStack_11c + (long)(int)uVar19 + uVar26 + 3);
          uVar30 = 0;
          do {
            bVar3 = local_118[uVar30 + uVar26];
            local_118[uVar30 + uVar26] = *pbVar27;
            *pbVar27 = bVar3;
            uVar30 = uVar30 + 1;
            pbVar27 = pbVar27 + -1;
          } while (uVar19 >> 1 != uVar30);
        }
      }
      if (local_118[0] == 0) {
        lVar23 = 0;
      }
      else {
        lVar23 = 0;
        do {
          lVar11 = lVar23 + 1;
          lVar23 = lVar23 + 1;
        } while (local_118[lVar11] != 0);
      }
      goto LAB_00125b85;
    }
    goto LAB_00125b89;
  }
  local_b8 = (*(code *)f[2])(*f,(float)f[1].id,local_280,*local_258);
  local_b8 = local_b8 + (ctx->style).property.edit.cursor_size;
  local_1a0 = local_280;
  local_220 = piVar12;
  pnVar31 = local_248;
LAB_00125bb1:
  local_d8 = (float)local_238 - (float)local_268._0_4_;
  uStack_d4 = local_238._4_4_;
  fStack_d0 = fStack_230;
  fStack_cc = fStack_22c;
  local_268._0_8_ = &ctx->last_widget_state;
  fVar39 = (ctx->style).property.border;
  fVar35 = (ctx->style).property.padding.x;
  local_b8 = fVar35 + fVar35 + local_b8;
  fVar36 = local_128 - (local_178 + (float)local_148);
  if (fVar36 <= local_b8) {
    local_b8 = fVar36;
  }
  local_c8 = local_128 - (fVar35 + local_b8);
  fStack_c4 = local_158 + fVar39;
  fStack_c0 = fStack_124;
  fStack_bc = fStack_154;
  fStack_b4 = (float)local_238 - (fVar39 + fVar39);
  uStack_b0 = 0;
  uStack_ac = local_238._4_4_;
  local_23c = *local_288;
  fVar39 = local_158;
  fVar35 = fStack_154;
  fVar36 = fStack_150;
  fVar41 = fStack_14c;
  if ((pnVar31 != (nk_context *)0x0) && (local_23c == 0)) {
    r.y = fStack_c4;
    r.x = local_c8;
    r.h = fStack_b4;
    r.w = local_b8;
    fStack_84 = fStack_174;
    fStack_80 = fStack_170;
    fStack_7c = fStack_16c;
    fStack_94 = fStack_124;
    fStack_90 = fStack_120;
    fStack_8c = uStack_11c;
    local_98 = local_c8;
    local_88 = local_178 + (float)local_148;
    nVar20 = nk_button_behavior(&ctx->last_widget_state,r,&pnVar31->input,NK_BUTTON_DEFAULT);
    fVar41 = fStack_14c;
    fVar36 = fStack_150;
    fVar35 = fStack_154;
    fVar39 = local_158;
    iVar21 = 1;
    if (((nVar20 != 0) ||
        ((((fVar37 = (pnVar31->input).mouse.buttons[0].clicked_pos.x, local_178 <= fVar37 &&
           (fVar37 < local_88)) &&
          (fVar38 = (pnVar31->input).mouse.buttons[0].clicked_pos.y, fStack_174 <= fVar38)) &&
         (((fVar38 < fStack_174 + local_d8 && ((pnVar31->input).mouse.buttons[0].down == 1)) &&
          (iVar21 = 2, (pnVar31->input).mouse.buttons[0].clicked != 0)))))) ||
       (((local_88 <= fVar37 && (fVar37 < (local_98 - local_88) + local_88)) &&
        ((fVar37 = (pnVar31->input).mouse.buttons[0].clicked_pos.y, local_158 <= fVar37 &&
         (((fVar37 < local_158 + (float)local_238 && ((pnVar31->input).mouse.buttons[0].down == 1))
          && (iVar21 = 2, (pnVar31->input).mouse.buttons[0].clicked != 0)))))))) {
      *local_288 = iVar21;
    }
  }
  if (*local_288 == 2) {
    if (pnVar31 == (nk_context *)0x0) {
      bVar33 = false;
      bVar34 = false;
    }
    else {
      bVar33 = (pnVar31->input).mouse.buttons[0].down != 0;
      fVar37 = (pnVar31->input).mouse.buttons[0].clicked_pos.x;
      bVar34 = false;
      if ((local_208.x <= fVar37) && (bVar34 = false, fVar37 < local_188)) {
        fVar37 = (pnVar31->input).mouse.buttons[0].clicked_pos.y;
        bVar34 = false;
        if ((fVar39 <= fVar37) && (fVar37 < fVar39 + (float)local_238)) {
          bVar34 = (pnVar31->input).mouse.buttons[0].down == 1;
        }
      }
    }
    *(uint *)local_268._0_8_ = *(uint *)local_268._0_8_ & 2 | 4;
    if (((pnVar31 != (nk_context *)0x0) &&
        (fVar37 = (pnVar31->input).mouse.pos.x, local_208.x <= fVar37)) &&
       ((fVar37 < local_188 &&
        ((fVar37 = (pnVar31->input).mouse.pos.y, fVar39 <= fVar37 &&
         (fVar37 < fVar39 + (float)local_238)))))) {
      *(uint *)local_268._0_8_ = 0x12;
    }
    if ((bool)(bVar33 & bVar34)) {
      fVar37 = local_1c8 * (pnVar31->input).mouse.delta.x;
      nVar4 = variant->kind;
      if (nVar4 == NK_PROPERTY_DOUBLE) {
        dVar7 = (double)fVar37 + (variant->value).d;
        if ((variant->max_value).d <= dVar7) {
          dVar7 = (variant->max_value).d;
        }
        dVar8 = (variant->min_value).d;
        if ((variant->min_value).d <= dVar7) {
          dVar8 = dVar7;
        }
        (variant->value).d = dVar8;
      }
      else if (nVar4 == NK_PROPERTY_FLOAT) {
        fVar37 = fVar37 + (variant->value).f;
        if ((variant->max_value).f <= fVar37) {
          fVar37 = (variant->max_value).f;
        }
        fVar38 = (variant->min_value).f;
        if ((variant->min_value).f <= fVar37) {
          fVar38 = fVar37;
        }
        (variant->value).f = fVar38;
      }
      else if (nVar4 == NK_PROPERTY_INT) {
        iVar21 = (int)fVar37 + (variant->value).i;
        if ((variant->max_value).i <= iVar21) {
          iVar21 = (variant->max_value).i;
        }
        if (iVar21 <= (variant->min_value).i) {
          iVar21 = (variant->min_value).i;
        }
        (variant->value).i = iVar21;
      }
      *(uint *)local_268._0_8_ = 0x22;
    }
    if ((((*(uint *)local_268._0_8_ & 0x10) != 0) &&
        ((((uVar19 = 8, pnVar31 == (nk_context *)0x0 ||
           (fVar37 = (pnVar31->input).mouse.prev.x, fVar37 < local_208.x)) || (local_188 <= fVar37))
         || ((fVar37 = (pnVar31->input).mouse.prev.y, fVar37 < fVar39 ||
             (fVar39 + (float)local_238 <= fVar37)))))) ||
       (((pnVar31 != (nk_context *)0x0 &&
         ((fVar37 = (pnVar31->input).mouse.prev.x, local_208.x <= fVar37 && (fVar37 < local_188))))
        && ((fVar37 = (pnVar31->input).mouse.prev.y, fVar39 <= fVar37 &&
            (uVar19 = 0x40, fVar37 < fVar39 + (float)local_238)))))) {
      *(uint *)local_268._0_8_ = *(uint *)local_268._0_8_ | uVar19;
    }
    if ((*(byte *)local_268._0_8_ & 0x20) == 0) {
      *local_288 = 0;
    }
  }
  local_238._0_4_ = (float)local_238 * 0.5;
  b = &local_210->buffer;
  p_Var6 = (ctx->style).property.draw_begin;
  fVar37 = fVar39 + local_1c4;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_158 = fVar39 + local_1c4;
    fStack_154 = fVar35;
    fStack_150 = fVar36;
    fStack_14c = fVar41;
    (*p_Var6)(b,(ctx->style).property.userdata);
    fVar37 = local_158;
  }
  if ((*(uint *)local_268._0_8_ & 0x20) == 0) {
    if ((*(uint *)local_268._0_8_ & 0x10) == 0) {
      pnVar32 = &(ctx->style).property;
      local_198.text = (ctx->style).property.label_normal;
    }
    else {
      pnVar32 = (nk_style_property *)&(ctx->style).property.hover;
      local_198.text = (ctx->style).property.label_hover;
    }
  }
  else {
    pnVar32 = (nk_style_property *)&(ctx->style).property.active;
    local_198.text = (ctx->style).property.label_active;
  }
  local_238 = (nk_command_buffer *)
              CONCAT44(local_238._4_4_,((float)local_238 + fVar37) - (float)local_1f8._0_4_ * 0.5);
  uVar10 = CONCAT44(local_d8,(int)local_148);
  uStack_140 = CONCAT44(uStack_d4,local_148._4_4_);
  local_148 = uVar10;
  if ((pnVar32->normal).type == NK_STYLE_ITEM_IMAGE) {
    r_00.w = local_168;
    r_00.h = fStack_164;
    r_00.x = local_208.x;
    r_00.y = local_208.y;
    nk_draw_image(b,r_00,&(pnVar32->normal).data.image,(nk_color)0xffffffff);
    local_198.background.r = '\0';
    local_198.background.g = '\0';
    local_198.background.b = '\0';
    local_198.background.a = '\0';
  }
  else {
    local_198.background = (pnVar32->normal).data.color;
    rect.w = local_168;
    rect.h = fStack_164;
    rect.x = local_208.x;
    rect.y = local_208.y;
    nk_fill_rect(b,rect,(ctx->style).property.rounding,local_198.background);
    rect_00.w = local_168;
    rect_00.h = fStack_164;
    rect_00.x = local_208.x;
    rect_00.y = local_208.y;
    nk_stroke_rect(b,rect_00,(ctx->style).property.rounding,(ctx->style).property.border,
                   (pnVar32->normal).data.color);
  }
  fVar39 = local_138._4_4_;
  local_1f8._4_4_ = local_1f8._0_4_;
  local_1f8._8_4_ = local_1f8._0_4_;
  local_1f8._12_4_ = local_1f8._0_4_;
  local_138 = CONCAT44((float)local_238,(float)local_138);
  uStack_130 = CONCAT44(local_238._4_4_,fVar39);
  local_198.padding.x = 0.0;
  local_198.padding.y = 0.0;
  b_00.y = fStack_174;
  b_00.x = local_178;
  b_00.w = (float)local_148;
  b_00.h = (float)local_148._4_4_;
  nk_widget_text(b,b_00,name,(int)lVar29,&local_198,0x12,(nk_user_font *)f);
  behavior = local_1c0;
  pnVar31 = local_248;
  p_Var6 = (ctx->style).property.draw_end;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var6)(b,(ctx->style).property.userdata);
  }
  fStack_120 = fStack_124;
  auVar15 = local_1f8;
  fStack_124 = (float)local_238;
  uStack_11c = (float)local_238._4_4_;
  bounds_00.w = (float)local_1f8._0_4_;
  bounds_00.h = (float)local_1f8._4_4_;
  bounds_00.x = (float)local_138;
  bounds_00.y = local_138._4_4_;
  local_238 = b;
  local_1f8 = auVar15;
  nVar20 = nk_do_button_symbol((nk_flags *)local_268._0_8_,b,bounds_00,
                               (ctx->style).property.sym_left,behavior,
                               &(ctx->style).property.dec_button,&pnVar31->input,(nk_user_font *)f);
  auVar15 = local_1f8;
  if (nVar20 != 0) {
    nVar4 = variant->kind;
    if (nVar4 == NK_PROPERTY_DOUBLE) {
      dVar7 = (variant->value).d - (variant->step).d;
      if ((variant->max_value).d <= dVar7) {
        dVar7 = (variant->max_value).d;
      }
      dVar8 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar7) {
        dVar8 = dVar7;
      }
      (variant->value).d = dVar8;
    }
    else if (nVar4 == NK_PROPERTY_FLOAT) {
      fVar39 = (variant->value).f - (variant->step).f;
      if ((variant->max_value).f <= fVar39) {
        fVar39 = (variant->max_value).f;
      }
      fVar35 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar39) {
        fVar35 = fVar39;
      }
      (variant->value).f = fVar35;
    }
    else if (nVar4 == NK_PROPERTY_INT) {
      iVar21 = (variant->value).i - (variant->step).i;
      if ((variant->max_value).i <= iVar21) {
        iVar21 = (variant->max_value).i;
      }
      if (iVar21 <= (variant->min_value).i) {
        iVar21 = (variant->min_value).i;
      }
      (variant->value).i = iVar21;
    }
  }
  bounds_01.y = fStack_124;
  bounds_01.x = local_128;
  bounds_01.w = (float)local_1f8._0_4_;
  bounds_01.h = (float)local_1f8._4_4_;
  local_1f8 = auVar15;
  nVar20 = nk_do_button_symbol((nk_flags *)local_268._0_8_,local_238,bounds_01,
                               (ctx->style).property.sym_right,behavior,
                               &(ctx->style).property.inc_button,&pnVar31->input,(nk_user_font *)f);
  piVar12 = local_220;
  if (nVar20 != 0) {
    nVar4 = variant->kind;
    if (nVar4 == NK_PROPERTY_DOUBLE) {
      dVar7 = (variant->value).d + (variant->step).d;
      if ((variant->max_value).d <= dVar7) {
        dVar7 = (variant->max_value).d;
      }
      dVar8 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar7) {
        dVar8 = dVar7;
      }
      (variant->value).d = dVar8;
    }
    else if (nVar4 == NK_PROPERTY_FLOAT) {
      fVar39 = (variant->value).f + (variant->step).f;
      if ((variant->max_value).f <= fVar39) {
        fVar39 = (variant->max_value).f;
      }
      fVar35 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar39) {
        fVar35 = fVar39;
      }
      (variant->value).f = fVar35;
    }
    else if (nVar4 == NK_PROPERTY_INT) {
      iVar21 = (variant->step).i + (variant->value).i;
      if ((variant->max_value).i <= iVar21) {
        iVar21 = (variant->max_value).i;
      }
      if (iVar21 <= (variant->min_value).i) {
        iVar21 = (variant->min_value).i;
      }
      (variant->value).i = iVar21;
    }
  }
  if ((local_23c == 1) || (*local_288 != 1)) {
    uVar19 = (uint)(*local_288 == 1);
    pcVar25 = local_1a0;
  }
  else {
    nk_memcopy(local_280,local_1a0,(long)*local_220);
    iVar21 = nk_utf_len(local_280,*piVar12);
    *local_218 = iVar21;
    *local_258 = *piVar12;
    uVar19 = 0;
    local_220 = local_258;
    pcVar25 = local_280;
  }
  piVar17 = local_1d8;
  piVar16 = local_1e0;
  piVar13 = local_218;
  piVar12 = local_220;
  pnVar31 = local_248;
  filter_00 = (nk_plugin_filter)(&PTR_nk_filter_decimal_00198490)[local_1b8];
  (ctx->text_edit).undo.undo_point = 0;
  (ctx->text_edit).undo.redo_point = 99;
  (ctx->text_edit).undo.undo_char_point = 0;
  (ctx->text_edit).undo.redo_char_point = 999;
  (ctx->text_edit).cursor = 0;
  (ctx->text_edit).select_start = 0;
  (ctx->text_edit).select_end = 0;
  (ctx->text_edit).mode = '\0';
  (ctx->text_edit).cursor_at_end_of_line = '\0';
  (ctx->text_edit).initialized = '\x01';
  (ctx->text_edit).has_preferred_x = '\0';
  (ctx->text_edit).preferred_x = 0.0;
  (ctx->text_edit).single_line = '\x01';
  (ctx->text_edit).filter = filter_00;
  (ctx->text_edit).scrollbar.x = 0.0;
  (ctx->text_edit).scrollbar.y = 0.0;
  local_1f8._0_4_ = uVar19;
  (ctx->text_edit).active = (uchar)uVar19;
  (ctx->text_edit).string.len = *local_220;
  iVar21 = *local_220;
  if (*local_218 < *local_220) {
    iVar21 = *local_218;
  }
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  (ctx->text_edit).cursor = iVar21;
  iVar21 = *local_220;
  if (*local_1e0 < *local_220) {
    iVar21 = *local_1e0;
  }
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  (ctx->text_edit).select_start = iVar21;
  iVar21 = *local_220;
  if (*local_1d8 < *local_220) {
    iVar21 = *local_1d8;
  }
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  (ctx->text_edit).select_end = iVar21;
  (ctx->text_edit).string.buffer.allocated = (long)*local_220;
  (ctx->text_edit).string.buffer.memory.size = 0x40;
  (ctx->text_edit).string.buffer.memory.ptr = pcVar25;
  (ctx->text_edit).string.buffer.size = 0x40;
  (ctx->text_edit).mode = '\x01';
  pnVar24 = (nk_context *)0x0;
  if (*local_288 == 1) {
    pnVar24 = local_248;
  }
  bounds_02.y = fStack_c4;
  bounds_02.x = local_c8;
  bounds_02.h = fStack_b4;
  bounds_02.w = local_b8;
  nk_do_edit((nk_flags *)local_268._0_8_,local_238,bounds_02,0x262,filter_00,&ctx->text_edit,
             &(ctx->style).property.edit,&pnVar24->input,(nk_user_font *)local_250);
  iVar21 = local_1bc;
  pnVar14 = local_210;
  pnVar24 = local_248;
  *piVar12 = (ctx->text_edit).string.len;
  *piVar13 = (ctx->text_edit).cursor;
  *piVar16 = (ctx->text_edit).select_start;
  *piVar17 = (ctx->text_edit).select_end;
  if ((pnVar31 != (nk_context *)0x0) && ((ctx->text_edit).active != '\0')) {
    uVar19 = (local_248->input).keyboard.keys[4].clicked;
    if ((local_248->input).keyboard.keys[4].down == 0) {
      if (1 < uVar19) goto LAB_0012654d;
    }
    else if (uVar19 != 0) {
LAB_0012654d:
      (ctx->text_edit).active = '\0';
    }
  }
  if ((local_1f8._0_4_ != 0) && ((ctx->text_edit).active == '\0')) {
    *local_288 = 0;
    local_280[*local_258] = 0;
    nVar4 = variant->kind;
    if (nVar4 == NK_PROPERTY_INT) {
      iVar22 = nk_strtoi(local_280,(char **)0x0);
      iVar28 = (variant->max_value).i;
      if (iVar22 < (variant->max_value).i) {
        iVar28 = iVar22;
      }
      if (iVar28 <= (variant->min_value).i) {
        iVar28 = (variant->min_value).i;
      }
      (variant->value).i = iVar28;
    }
    else {
      if (nVar4 == NK_PROPERTY_FLOAT) {
        iVar28 = 0;
        pcVar25 = local_280;
        do {
          iVar22 = 1;
          if (*pcVar25 != 0x2e) {
            if (*pcVar25 == 0) goto LAB_00126738;
            if (iVar28 == 3) goto LAB_00126735;
            iVar22 = (uint)(0 < iVar28) + iVar28;
          }
          iVar28 = iVar22;
          pcVar25 = pcVar25 + 1;
        } while( true );
      }
      if (nVar4 == NK_PROPERTY_DOUBLE) {
        iVar28 = 0;
        pcVar25 = local_280;
        do {
          iVar22 = 1;
          if (*pcVar25 != 0x2e) {
            if (*pcVar25 == 0) goto LAB_00126766;
            if (iVar28 == 3) goto LAB_00126763;
            iVar22 = (uint)(0 < iVar28) + iVar28;
          }
          iVar28 = iVar22;
          pcVar25 = pcVar25 + 1;
        } while( true );
      }
    }
  }
LAB_00126575:
  piVar12 = local_258;
  if (((pnVar24 != (nk_context *)0x0) && (*local_288 != 0)) && ((pnVar14->property).active == 0)) {
    (pnVar14->property).active = 1;
    nk_memcopy((pnVar14->property).buffer,local_280,(long)*local_258);
    (pnVar14->property).length = *piVar12;
    (pnVar14->property).cursor = *local_218;
    (pnVar14->property).state = *local_288;
    (pnVar14->property).name = local_1cc;
    (pnVar14->property).select_start = *local_1e0;
    (pnVar14->property).select_end = *local_1d8;
    if (*local_288 == 2) {
      (ctx->input).mouse.grab = '\x01';
      (ctx->input).mouse.grabbed = '\x01';
    }
  }
  if (iVar21 != 0 && *local_288 == 0) {
    if (iVar21 == 2) {
      (ctx->input).mouse.grab = '\0';
      (ctx->input).mouse.grabbed = '\0';
      (ctx->input).mouse.ungrab = '\x01';
    }
    (pnVar14->property).select_start = 0;
    (pnVar14->property).select_end = 0;
    (pnVar14->property).active = 0;
  }
  return;
LAB_00125a82:
  local_118[lVar23] = 0;
LAB_00125b85:
  local_26c = (int)lVar23;
LAB_00125b89:
  f = local_250;
  local_220 = &local_26c;
  local_1a0 = (char *)local_118;
  local_b8 = (*(code *)local_250[2])(*local_250,(float)local_250[1].id,local_1a0,local_26c);
  goto LAB_00125bb1;
LAB_00126735:
  *pcVar25 = 0;
LAB_00126738:
  dVar7 = nk_strtod(local_280,(char **)0x0);
  fVar39 = (float)dVar7;
  if ((variant->max_value).f <= (float)dVar7) {
    fVar39 = (variant->max_value).f;
  }
  fVar35 = (variant->min_value).f;
  if ((variant->min_value).f <= fVar39) {
    fVar35 = fVar39;
  }
  (variant->value).f = fVar35;
  goto LAB_00126575;
LAB_00126763:
  *pcVar25 = 0;
LAB_00126766:
  dVar7 = nk_strtod(local_280,(char **)0x0);
  iVar28 = SUB84(dVar7,0);
  uVar40 = (undefined4)((ulong)dVar7 >> 0x20);
  nVar2 = variant->max_value;
  if (nVar2.d <= dVar7) {
    iVar28 = nVar2.i;
    uVar40 = nVar2._4_4_;
  }
  nVar2 = variant->min_value;
  iVar22 = nVar2.i;
  uVar42 = nVar2._4_4_;
  if (nVar2.d <= (double)CONCAT44(uVar40,iVar28)) {
    iVar22 = iVar28;
    uVar42 = uVar40;
  }
  nVar2._4_4_ = uVar42;
  nVar2.i = iVar22;
  variant->value = nVar2;
  goto LAB_00126575;
}

Assistant:

NK_LIB void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
float inc_per_pixel, const enum nk_property_filter filter)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states s;

int *state = 0;
nk_hash hash = 0;
char *buffer = 0;
int *len = 0;
int *cursor = 0;
int *select_begin = 0;
int *select_end = 0;
int old_state;

char dummy_buffer[NK_MAX_NUMBER_BUFFER];
int dummy_state = NK_PROPERTY_DEFAULT;
int dummy_length = 0;
int dummy_cursor = 0;
int dummy_select_begin = 0;
int dummy_select_end = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
style = &ctx->style;
s = nk_widget(&bounds, ctx);
if (!s) return;

/* calculate hash from name */
if (name[0] == '#') {
hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
name++; /* special number hash */
} else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

/* check if property is currently hot item */
if (win->property.active && hash == win->property.name) {
buffer = win->property.buffer;
len = &win->property.length;
cursor = &win->property.cursor;
state = &win->property.state;
select_begin = &win->property.select_start;
select_end = &win->property.select_end;
} else {
buffer = dummy_buffer;
len = &dummy_length;
cursor = &dummy_cursor;
state = &dummy_state;
select_begin =  &dummy_select_begin;
select_end = &dummy_select_end;
}

/* execute property widget */
old_state = *state;
ctx->text_edit.clip = ctx->clip;
in = ((s == NK_WIDGET_ROM && !win->property.active) ||
layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
select_end, &style->property, filter, in, style->font, &ctx->text_edit,
ctx->button_behavior);

if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
/* current property is now hot */
win->property.active = 1;
NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
win->property.length = *len;
win->property.cursor = *cursor;
win->property.state = *state;
win->property.name = hash;
win->property.select_start = *select_begin;
win->property.select_end = *select_end;
if (*state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_true;
ctx->input.mouse.grabbed = nk_true;
}
}
/* check if previously active property is now inactive */
if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
if (old_state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_false;
ctx->input.mouse.grabbed = nk_false;
ctx->input.mouse.ungrab = nk_true;
}
win->property.select_start = 0;
win->property.select_end = 0;
win->property.active = 0;
}
}